

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

cmFileListGeneratorBase * __thiscall
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase *this,cmFileListGeneratorBase *next)

{
  cmFileListGeneratorBase *pcVar1;
  auto_ptr<cmFileListGeneratorBase> aVar2;
  auto_ptr<cmFileListGeneratorBase> local_20;
  
  (*next->_vptr_cmFileListGeneratorBase[3])(&local_20);
  aVar2.x_ = local_20.x_;
  local_20.x_ = (cmFileListGeneratorBase *)0x0;
  pcVar1 = (this->Next).x_;
  if (pcVar1 != aVar2.x_) {
    if (pcVar1 != (cmFileListGeneratorBase *)0x0) {
      (*pcVar1->_vptr_cmFileListGeneratorBase[1])();
    }
    (this->Next).x_ = aVar2.x_;
  }
  if (local_20.x_ != (cmFileListGeneratorBase *)0x0) {
    (*(local_20.x_)->_vptr_cmFileListGeneratorBase[1])();
  }
  return (this->Next).x_;
}

Assistant:

cmFileListGeneratorBase* cmFileListGeneratorBase::SetNext(
  cmFileListGeneratorBase const& next)
{
  this->Next = next.Clone();
  return this->Next.get();
}